

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O2

void sptk::swipe::La(matrix L,vector f,vector fERBs,RealValuedFastFourierTransform *plan,
                    vector<double,_std::allocator<double>_> *fi,
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *fo,Buffer *buffer,int w2,int hi,int i)

{
  double dVar1;
  vector<double,_std::allocator<double>_> *real_part_output;
  pointer pvVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  double *pdVar8;
  uint uVar9;
  double *pdVar10;
  double *extraout_RDX_00;
  double *extraout_RDX_02;
  double *pdVar12;
  double *extraout_RDX_03;
  long lVar13;
  double *pdVar14;
  ulong uVar15;
  double dVar16;
  vector x;
  vector x_00;
  vector y;
  vector y_00;
  vector y_01;
  vector y2;
  vector y2_00;
  vector vVar17;
  vector yr_vector;
  vector yr_vector_00;
  vector yr_vector_01;
  double *pdVar11;
  double *extraout_RDX;
  double *extraout_RDX_01;
  
  pdVar14 = fERBs.v;
  pdVar8 = f.v;
  uVar9 = f.x;
  real_part_output =
       (fo->
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  bVar4 = RealValuedFastFourierTransform::Run(plan,fi,real_part_output,real_part_output + 1,buffer);
  if (bVar4) {
    pvVar2 = (fo->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar13 = *(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data;
    lVar3 = *(long *)&pvVar2[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    vVar17 = makev(w2);
    pdVar10 = vVar17.v;
    uVar5 = vVar17.x;
    uVar7 = 0;
    uVar15 = (ulong)(uint)w2;
    if (w2 < 1) {
      uVar15 = 0;
    }
    for (; uVar15 != uVar7; uVar7 = uVar7 + 1) {
      dVar16 = *(double *)(lVar13 + uVar7 * 8);
      dVar1 = *(double *)(lVar3 + uVar7 * 8);
      pdVar10[uVar7] = SQRT(dVar16 * dVar16 + dVar1 * dVar1);
    }
    vVar17._4_4_ = 0;
    vVar17.x = uVar9;
    y._4_4_ = 0;
    y.x = uVar5;
    vVar17.v = pdVar8;
    y.v = pdVar10;
    vVar17 = spline(vVar17,y);
    pdVar11 = vVar17.v;
    x._4_4_ = 0;
    x.x = uVar9;
    y_00._4_4_ = 0;
    y_00.x = uVar5;
    uVar6 = vVar17.x;
    y2._4_4_ = 0;
    y2.x = uVar6;
    x.v = pdVar8;
    y_00.v = pdVar10;
    y2.v = pdVar11;
    dVar16 = splinv(x,y_00,y2,*pdVar14,hi);
    if (dVar16 < 0.0) {
      dVar16 = sqrt(dVar16);
      pdVar12 = extraout_RDX_00;
    }
    else {
      dVar16 = SQRT(dVar16);
      pdVar12 = extraout_RDX;
    }
    *L.m[i] = (double)(-(ulong)!NAN(dVar16) & (ulong)dVar16);
    for (lVar13 = 1; lVar13 < L._0_8_ >> 0x20; lVar13 = lVar13 + 1) {
      yr_vector.v._0_4_ = hi;
      yr_vector._0_8_ = pdVar8;
      yr_vector.v._4_4_ = 0;
      hi = bilookv((swipe *)(ulong)uVar9,yr_vector,pdVar14[lVar13],i);
      x_00._4_4_ = 0;
      x_00.x = uVar9;
      y_01._4_4_ = 0;
      y_01.x = uVar5;
      y2_00._4_4_ = 0;
      y2_00.x = uVar6;
      x_00.v = pdVar8;
      y_01.v = pdVar10;
      y2_00.v = pdVar11;
      dVar16 = splinv(x_00,y_01,y2_00,pdVar14[lVar13],hi);
      if (dVar16 < 0.0) {
        dVar16 = sqrt(dVar16);
        pdVar12 = extraout_RDX_02;
      }
      else {
        dVar16 = SQRT(dVar16);
        pdVar12 = extraout_RDX_01;
      }
      L.m[i][lVar13] = (double)(-(ulong)!NAN(dVar16) & (ulong)dVar16);
    }
    yr_vector_00.v = pdVar12;
    yr_vector_00._0_8_ = pdVar10;
    freev((swipe *)(ulong)uVar5,yr_vector_00);
    yr_vector_01.v = extraout_RDX_03;
    yr_vector_01._0_8_ = pdVar11;
    freev((swipe *)(ulong)uVar6,yr_vector_01);
    return;
  }
  return;
}

Assistant:

void La(matrix L, vector f, vector fERBs,
                  const sptk::RealValuedFastFourierTransform& plan,
                  const std::vector<double>& fi,
                  std::vector<std::vector<double> >* fo,
                  sptk::RealValuedFastFourierTransform::Buffer* buffer,
                  int w2, int hi, int i) {
    int j;
    if (!plan.Run(fi, &((*fo)[0]), &((*fo)[1]), buffer))
        return;
    double* fo0 = &(((*fo)[0])[0]);
    double* fo1 = &(((*fo)[1])[0]);
    vector a = makev(w2);
    for (j = 0; j < w2; j++) // this iterates over only the first half
        a.v[j] = sqrt(fo0[j] * fo0[j] + fo1[j] * fo1[j]);
#endif
    vector a2 = spline(f, a); // a2 is now the result of the cubic spline
    L.m[i][0] = fixnan(sqrt(splinv(f, a, a2, fERBs.v[0], hi)));
    for (j = 1; j < L.y; j++) { // perform a bisection query at ERB intvls
        hi = bilookv(f, fERBs.v[j], hi); 
        L.m[i][j] = fixnan(sqrt(splinv(f, a, a2, fERBs.v[j], hi)));
    }
    freev(a); 
    freev(a2);
}